

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_smoothStep_vec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  Vector<float,_2> res;
  float local_28 [2];
  ulong local_20;
  ulong local_18 [2];
  int local_8 [2];
  
  local_28[0] = c->in[0].m_data[3];
  local_28[1] = c->in[0].m_data[1];
  uVar3 = *(ulong *)c->in[1].m_data;
  local_18[0] = uVar3 << 0x20 | uVar3 >> 0x20;
  uVar3 = *(ulong *)(c->in[2].m_data + 1);
  local_20 = uVar3 << 0x20 | uVar3 >> 0x20;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar4 = 0;
  do {
    fVar5 = local_28[lVar4];
    fVar1 = *(float *)((long)local_18 + lVar4 * 4 + -8);
    fVar6 = 0.0;
    if (fVar5 < fVar1) {
      fVar2 = *(float *)((long)local_18 + lVar4 * 4);
      fVar6 = 1.0;
      if (fVar1 < fVar2) {
        fVar5 = (fVar1 - fVar5) / (fVar2 - fVar5);
        fVar6 = (3.0 - (fVar5 + fVar5)) * fVar5 * fVar5;
      }
    }
    res.m_data[lVar4] = fVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar4 = 0;
  do {
    (c->color).m_data[local_8[lVar4]] = res.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }